

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  pointer pcVar1;
  pointer pcVar2;
  cmState *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer pbVar9;
  pointer key;
  SaveCacheEntry save;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  ostringstream warning;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  char *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  CacheEntryType local_210;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_1a8 + 0x10;
  pcVar2 = (var->_M_dataplus)._M_p;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + var->_M_string_length);
  cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1e8,true);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar3 = this->State;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  cmState::SetGlobalProperty(pcVar3,(string *)local_1a8,"");
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar5 = cmState::GetIsInTryCompile(this->State);
  iVar6 = 0;
  if (!bVar5) {
    local_208.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "You have changed variables that require your cache to be deleted.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Configure will be re-run and you may have to reset some variables.\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The following variables have changed:\n",0x26);
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar9 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_250._M_p = (pointer)&local_240;
        local_270._8_8_ = 0;
        local_270[0x10] = '\0';
        local_248 = 0;
        local_240._M_local_buf[0] = '\0';
        local_230._M_p = (pointer)&local_220;
        local_228 = (char *)0x0;
        local_220._M_local_buf[0] = '\0';
        local_270._0_8_ = local_270 + 0x10;
        std::__cxx11::string::_M_assign((string *)local_270);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"= ",2);
        std::__cxx11::string::_M_assign((string *)&local_250);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar9[1]._M_dataplus._M_p,
                            pbVar9[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        pcVar8 = cmState::GetCacheEntryValue(this->State,(string *)local_270);
        if (pcVar8 != (char *)0x0) {
          local_210 = cmState::GetCacheEntryType(this->State,(string *)local_270);
          pcVar3 = this->State;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"HELPSTRING","");
          pcVar8 = cmState::GetCacheEntryProperty(pcVar3,(string *)local_270,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = local_228;
          if (pcVar8 != (char *)0x0) {
            strlen(pcVar8);
            std::__cxx11::string::_M_replace((ulong)&local_230,0,pcVar4,(ulong)pcVar8);
          }
        }
        std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back
                  (&local_208,(value_type *)local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_p != &local_220) {
          operator_delete(local_230._M_p,
                          CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p,
                          CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
        }
        pbVar9 = pbVar9 + 2;
      } while (pbVar9 != local_1e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar8 = cmState::GetBinaryDirectory(this->State);
    std::__cxx11::string::string((string *)local_270,pcVar8,(allocator *)&local_1c8);
    cmState::DeleteCache(this->State,(string *)local_270);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
    }
    LoadCache(this);
    for (key = local_208.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl
               .super__Vector_impl_data._M_start;
        key != local_208.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl
               .super__Vector_impl_data._M_finish; key = key + 1) {
      cmState::AddCacheEntry
                (this->State,&key->key,(key->value)._M_dataplus._M_p,(key->help)._M_dataplus._M_p,
                 key->type);
      UnwatchUnusedCli(this,&key->key);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_270._0_8_,(char *)0x0);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
    }
    iVar6 = 0;
    if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
      bVar5 = cmSystemTools::GetInterruptFlag();
      if (!bVar5) {
        iVar6 = Configure(this);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&local_208);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return iVar6;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->State->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (std::vector<std::string>::iterator i = argsSplit.begin();
       i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (const char* help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = help;
      }
    }
    saved.push_back(save);
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (std::vector<SaveCacheEntry>::iterator i = saved.begin();
       i != saved.end(); ++i) {
    this->AddCacheEntry(i->key, i->value.c_str(), i->help.c_str(), i->type);
  }
  cmSystemTools::Message(warning.str().c_str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccuredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}